

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdiarea.cpp
# Opt level: O0

void __thiscall QMdiArea::removeSubWindow(QMdiArea *this,QWidget *widget)

{
  long lVar1;
  bool bVar2;
  QMdiAreaPrivate *lhs;
  qsizetype qVar3;
  const_iterator o;
  QWidget *pQVar4;
  QWidget *in_RSI;
  QMdiAreaPrivate *in_RDI;
  long in_FS_OFFSET;
  QMdiSubWindow *child_1;
  QList<QPointer<QMdiSubWindow>_> *__range1;
  bool found;
  QMdiAreaPrivate *d;
  const_iterator __end1;
  const_iterator __begin1;
  QList<QPointer<QMdiSubWindow>_> subWindows;
  int index;
  QMdiSubWindow *child;
  QList<QPointer<QMdiSubWindow>_> *in_stack_ffffffffffffff08;
  QListSpecialMethodsBase<QPointer<QMdiSubWindow>_> *in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff1c;
  QWidget *in_stack_ffffffffffffff28;
  QWidget *in_stack_ffffffffffffff30;
  undefined7 in_stack_ffffffffffffff38;
  undefined1 in_stack_ffffffffffffff3f;
  byte bVar5;
  QMdiSubWindow *in_stack_ffffffffffffff58;
  const_iterator local_78;
  undefined1 *local_70;
  undefined1 *local_68;
  undefined1 *local_60;
  char local_58 [36];
  int local_34;
  QMdiSubWindow *local_30;
  char local_28 [16];
  QWidget *in_stack_ffffffffffffffe8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_RSI == (QWidget *)0x0) {
    QMessageLogger::QMessageLogger
              ((QMessageLogger *)in_RDI,
               (char *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
               (int)((ulong)in_stack_ffffffffffffff10 >> 0x20),(char *)in_stack_ffffffffffffff08);
    QMessageLogger::warning(local_28,"QMdiArea::removeSubWindow: null pointer to widget");
  }
  else {
    lhs = d_func((QMdiArea *)0x613b50);
    bVar2 = QList<QPointer<QMdiSubWindow>_>::isEmpty((QList<QPointer<QMdiSubWindow>_> *)0x613b66);
    if (!bVar2) {
      local_30 = qobject_cast<QMdiSubWindow*>((QObject *)0x613b7b);
      if (local_30 == (QMdiSubWindow *)0x0) {
        bVar5 = 0;
        local_70 = &DAT_aaaaaaaaaaaaaaaa;
        local_68 = &DAT_aaaaaaaaaaaaaaaa;
        local_60 = &DAT_aaaaaaaaaaaaaaaa;
        QList<QPointer<QMdiSubWindow>_>::QList
                  ((QList<QPointer<QMdiSubWindow>_> *)in_stack_ffffffffffffff10,
                   in_stack_ffffffffffffff08);
        local_78.i = (QPointer<QMdiSubWindow> *)&DAT_aaaaaaaaaaaaaaaa;
        local_78 = QList<QPointer<QMdiSubWindow>_>::begin
                             ((QList<QPointer<QMdiSubWindow>_> *)in_stack_ffffffffffffff10);
        o = QList<QPointer<QMdiSubWindow>_>::end
                      ((QList<QPointer<QMdiSubWindow>_> *)in_stack_ffffffffffffff10);
        while (bVar2 = QList<QPointer<QMdiSubWindow>_>::const_iterator::operator!=(&local_78,o),
              bVar2) {
          QList<QPointer<QMdiSubWindow>_>::const_iterator::operator*(&local_78);
          ::QPointer::operator_cast_to_QMdiSubWindow_((QPointer<QMdiSubWindow> *)0x613d72);
          bVar2 = sanityCheck((QMdiSubWindow *)in_stack_ffffffffffffff10,
                              (char *)in_stack_ffffffffffffff08);
          if ((bVar2) &&
             (pQVar4 = QMdiSubWindow::widget((QMdiSubWindow *)0x613d98), pQVar4 == in_RSI)) {
            QMdiSubWindow::setWidget(in_stack_ffffffffffffff58,in_stack_ffffffffffffffe8);
            bVar5 = 1;
            break;
          }
          QList<QPointer<QMdiSubWindow>_>::const_iterator::operator++(&local_78);
        }
        if (((bVar5 ^ 0xff) & 1) != 0) {
          QMessageLogger::QMessageLogger
                    ((QMessageLogger *)in_RDI,
                     (char *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                     (int)((ulong)in_stack_ffffffffffffff10 >> 0x20),
                     (char *)in_stack_ffffffffffffff08);
          QMessageLogger::warning
                    (&stack0xffffffffffffff58,
                     "QMdiArea::removeSubWindow: widget is not child of any window inside QMdiArea")
          ;
        }
        QList<QPointer<QMdiSubWindow>_>::~QList((QList<QPointer<QMdiSubWindow>_> *)0x613e0b);
      }
      else {
        qVar3 = QListSpecialMethodsBase<QPointer<QMdiSubWindow>>::indexOf<QMdiSubWindow*>
                          (in_stack_ffffffffffffff10,(QMdiSubWindow **)in_stack_ffffffffffffff08,
                           0x613baf);
        local_34 = (int)qVar3;
        if (local_34 == -1) {
          QMessageLogger::QMessageLogger
                    ((QMessageLogger *)in_RDI,
                     (char *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                     (int)((ulong)in_stack_ffffffffffffff10 >> 0x20),
                     (char *)in_stack_ffffffffffffff08);
          QMessageLogger::warning
                    (local_58,"QMdiArea::removeSubWindow: window is not inside workspace");
        }
        else {
          QMdiAreaPrivate::disconnectSubWindow
                    (in_RDI,(QObject *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18)
                    );
          QList<QPointer<QMdiSubWindow>>::removeAll<QMdiSubWindow*>
                    ((QList<QPointer<QMdiSubWindow>_> *)in_stack_ffffffffffffff10,
                     (QMdiSubWindow **)in_stack_ffffffffffffff08);
          QList<int>::removeAll<int>
                    ((QList<int> *)in_stack_ffffffffffffff10,(int *)in_stack_ffffffffffffff08);
          ::operator==((QPointer<QMdiSubWindow> *)lhs,(QMdiSubWindow **)in_stack_ffffffffffffff08);
          QMdiAreaPrivate::updateActiveWindow
                    ((QMdiAreaPrivate *)
                     CONCAT17(in_stack_ffffffffffffff3f,in_stack_ffffffffffffff38),
                     (int)((ulong)in_stack_ffffffffffffff30 >> 0x20),
                     SUB81((ulong)in_stack_ffffffffffffff30 >> 0x18,0));
          QWidget::setParent(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
        }
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QMdiArea::removeSubWindow(QWidget *widget)
{
    if (Q_UNLIKELY(!widget)) {
        qWarning("QMdiArea::removeSubWindow: null pointer to widget");
        return;
    }

    Q_D(QMdiArea);
    if (d->childWindows.isEmpty())
        return;

    if (QMdiSubWindow *child = qobject_cast<QMdiSubWindow *>(widget)) {
        int index = d->childWindows.indexOf(child);
        if (Q_UNLIKELY(index == -1)) {
            qWarning("QMdiArea::removeSubWindow: window is not inside workspace");
            return;
        }
        d->disconnectSubWindow(child);
        d->childWindows.removeAll(child);
        d->indicesToActivatedChildren.removeAll(index);
        d->updateActiveWindow(index, d->active == child);
        child->setParent(nullptr);
        return;
    }

    bool found = false;
    // Take a copy because child->setWidget(nullptr) will indirectly
    // QCoreApplication::sendEvent(); the latter could call unknown code that could
    // e.g. recurse into the class modifying d->childWindows.
    const auto subWindows = d->childWindows;
    for (QMdiSubWindow *child : subWindows) {
        if (!sanityCheck(child, "QMdiArea::removeSubWindow"))
            continue;
        if (child->widget() == widget) {
            child->setWidget(nullptr);
            Q_ASSERT(!child->widget());
            found = true;
            break;
        }
    }

    if (Q_UNLIKELY(!found))
        qWarning("QMdiArea::removeSubWindow: widget is not child of any window inside QMdiArea");
}